

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int archive_compressor_zstd_free(archive_write_filter *f)

{
  void *__ptr;
  private_data_conflict8 *data;
  archive_write_filter *f_local;
  
  __ptr = f->data;
  ZSTD_freeCStream(*(ZSTD_CStream **)((long)__ptr + 8));
  free(*(void **)((long)__ptr + 0x18));
  free(__ptr);
  f->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_compressor_zstd_free(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
#if HAVE_ZSTD_H && HAVE_LIBZSTD
	ZSTD_freeCStream(data->cstream);
	free(data->out.dst);
#else
	__archive_write_program_free(data->pdata);
#endif
	free(data);
	f->data = NULL;
	return (ARCHIVE_OK);
}